

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_import.cpp
# Opt level: O2

void __thiscall
UnitsImport_importModifyAndParse_Test::UnitsImport_importModifyAndParse_Test
          (UnitsImport_importModifyAndParse_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00135b70;
  return;
}

Assistant:

TEST(UnitsImport, importModifyAndParse)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n"
        "    <units units_ref=\"a_units_in_that_model\" name=\"units_in_this_model\"/>\n"
        "  </import>\n"
        "  <units name=\"multiplied_import\">\n"
        "    <unit multiplier=\"5.6\" units=\"units_in_this_model\"/>\n"
        "  </units>\n"
        "  <units name=\"prefixed_import\">\n"
        "    <unit prefix=\"yotta\" units=\"units_in_this_model\"/>\n"
        "  </units>\n"
        "  <units name=\"exponented_import\">\n"
        "    <unit exponent=\"3\" units=\"units_in_this_model\"/>\n"
        "  </units>\n"
        "  <units name=\"all_import\">\n"
        "    <unit exponent=\"-4\" multiplier=\"-1.3\" prefix=\"-17\" units=\"units_in_this_model\"/>\n"
        "  </units>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ImportSourcePtr imp = libcellml::ImportSource::create();
    imp->setUrl("some-other-model.xml");

    libcellml::UnitsPtr importedUnits = libcellml::Units::create();
    importedUnits->setName("units_in_this_model");
    importedUnits->setSourceUnits(imp, "a_units_in_that_model");

    m->addUnits(importedUnits);

    libcellml::UnitsPtr importedUnitsMultiplied = libcellml::Units::create();
    importedUnitsMultiplied->setName("multiplied_import");
    importedUnitsMultiplied->addUnit("units_in_this_model", 0, 1.0, 5.6);

    m->addUnits(importedUnitsMultiplied);

    libcellml::UnitsPtr importedUnitsPrefixed = libcellml::Units::create();
    importedUnitsPrefixed->setName("prefixed_import");
    importedUnitsPrefixed->addUnit("units_in_this_model", libcellml::Units::Prefix::YOTTA);

    m->addUnits(importedUnitsPrefixed);

    libcellml::UnitsPtr importedUnitsExponented = libcellml::Units::create();
    importedUnitsExponented->setName("exponented_import");
    importedUnitsExponented->addUnit("units_in_this_model", 3.0);

    m->addUnits(importedUnitsExponented);

    libcellml::UnitsPtr importedUnitsAll = libcellml::Units::create();
    importedUnitsAll->setName("all_import");
    importedUnitsAll->addUnit("units_in_this_model", -17, -4.0, -1.3);

    m->addUnits(importedUnitsAll);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);

    // Parse
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);
    a = printer->printModel(model);
    EXPECT_EQ(e, a);

    // check units count
    EXPECT_EQ(size_t(5), model->unitsCount());
}